

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O2

bool __thiscall
prometheus::detail::MetricsHandler::handleGet
          (MetricsHandler *this,CivetServer *param_1,mg_connection *conn)

{
  bool bVar1;
  mg_connection *conn_00;
  int iVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *p_Var6;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *pvVar7;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *metrics_00;
  undefined1 auVar8 [16];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  mg_connection *local_110;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  string local_f0;
  long local_d0;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> metrics;
  TextSerializer serializer;
  z_stream zs;
  
  p_Var6 = &local_128;
  lVar3 = std::chrono::_V2::steady_clock::now();
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::mutex::lock(&this->collectables_mutex_);
  CollectMetrics((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)&zs,
                 &this->collectables_);
  metrics_00 = &metrics;
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::_M_move_assign
            (metrics_00,&zs);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)&zs);
  pthread_mutex_unlock((pthread_mutex_t *)&this->collectables_mutex_);
  serializer.super_Serializer._vptr_Serializer = (Serializer)&PTR__Serializer_0013cd30;
  Serializer::Serialize_abi_cxx11_(&local_f0,&serializer.super_Serializer,metrics_00);
  mg_printf(conn,"HTTP/1.1 200 OK\r\nContent-Type: text/plain; charset=utf-8\r\n");
  pcVar4 = mg_get_header(conn,"Accept-Encoding");
  if (pcVar4 != (char *)0x0) {
    pcVar4 = strstr(pcVar4,"gzip");
    if (pcVar4 != (char *)0x0) {
      zs.adler = 0;
      zs.reserved = 0;
      zs.opaque = (voidpf)0x0;
      zs.data_type = 0;
      zs._92_4_ = 0;
      zs.zalloc = (alloc_func)0x0;
      zs.zfree = (free_func)0x0;
      zs.msg = (char *)0x0;
      zs.state = (internal_state *)0x0;
      zs.avail_out = 0;
      zs._36_4_ = 0;
      zs.total_out = 0;
      zs.total_in = 0;
      zs.next_out = (Bytef *)0x0;
      zs.next_in = (Bytef *)0x0;
      zs.avail_in = 0;
      zs._12_4_ = 0;
      iVar2 = deflateInit2_(&zs,0xffffffffffffffff,8,0x1f,9,0,"1.2.11",0x70);
      local_110 = conn;
      if (iVar2 == 0) {
        zs.next_in = (Bytef *)local_f0._M_dataplus._M_p;
        zs.avail_in = (uInt)local_f0._M_string_length;
        local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d0 = lVar3;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,
                   local_f0._M_string_length >> 1);
        do {
          zs.avail_out = 0x8000;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,
                     zs.total_out + 0x8000);
          zs.next_out = (Bytef *)((long)&(((_Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                                            *)local_108._M_impl.super__Vector_impl_data._M_start)->
                                         _M_impl).super__Vector_impl_data._M_start + zs.total_out);
          iVar2 = deflate(&zs,4);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,
                     zs.total_out);
        } while (iVar2 == 0);
        deflateEnd(&zs);
        lVar3 = local_d0;
        conn_00 = local_110;
        if (iVar2 == 1) {
          local_128._M_impl.super__Vector_impl_data._M_start =
               local_108._M_impl.super__Vector_impl_data._M_start;
          local_128._M_impl.super__Vector_impl_data._M_finish =
               local_108._M_impl.super__Vector_impl_data._M_finish;
          local_128._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_108._M_impl.super__Vector_impl_data._M_end_of_storage;
          p_Var6 = &local_108;
          pvVar7 = (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
                   local_108._M_impl.super__Vector_impl_data._M_finish;
          metrics_00 = (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                        *)local_108._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          pvVar7 = (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
                   0x0;
          metrics_00 = (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                        *)0x0;
        }
        (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var6->_M_impl)->_M_impl)
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var6->_M_impl)->_M_impl)
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var6->_M_impl)->_M_impl)
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_108);
        if (metrics_00 == pvVar7) goto LAB_00119fb8;
        mg_printf(conn_00,"Content-Encoding: gzip\r\nContent-Length: %lu\r\n\r\n",
                  (long)pvVar7 - (long)metrics_00);
        mg_write(conn_00,local_128._M_impl.super__Vector_impl_data._M_start,
                 (long)local_128._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_128._M_impl.super__Vector_impl_data._M_start);
        metrics_00 = (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
                     ((long)local_128._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_128._M_impl.super__Vector_impl_data._M_start);
        bVar1 = false;
      }
      else {
        local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00119fb8:
        bVar1 = true;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
      conn = local_110;
      if (!bVar1) goto LAB_0011a140;
    }
  }
  mg_printf(conn,"Content-Length: %lu\r\n\r\n",local_f0._M_string_length);
  mg_write(conn,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  metrics_00 = (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
               local_f0._M_string_length;
LAB_0011a140:
  std::__cxx11::string::~string((string *)&local_f0);
  lVar5 = std::chrono::_V2::steady_clock::now();
  Summary::Observe(this->request_latencies_,(double)((lVar5 - lVar3) / 1000));
  auVar8._8_4_ = (int)((ulong)metrics_00 >> 0x20);
  auVar8._0_8_ = metrics_00;
  auVar8._12_4_ = 0x45300000;
  Counter::Increment(this->bytes_transferred_,
                     (auVar8._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)metrics_00) - 4503599627370496.0));
  Counter::Increment(this->num_scrapes_);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            (&metrics);
  return true;
}

Assistant:

bool MetricsHandler::handleGet(CivetServer*, struct mg_connection* conn) {
  auto start_time_of_request = std::chrono::steady_clock::now();

  std::vector<MetricFamily> metrics;

  {
    std::lock_guard<std::mutex> lock{collectables_mutex_};
    metrics = CollectMetrics(collectables_);
  }

  const TextSerializer serializer;

  auto bodySize = WriteResponse(conn, serializer.Serialize(metrics));

  auto stop_time_of_request = std::chrono::steady_clock::now();
  auto duration = std::chrono::duration_cast<std::chrono::microseconds>(
      stop_time_of_request - start_time_of_request);
  request_latencies_.Observe(duration.count());

  bytes_transferred_.Increment(bodySize);
  num_scrapes_.Increment();
  return true;
}